

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O1

SampleInfo * __thiscall
BasicContainer::sampleSurface
          (SampleInfo *__return_storage_ptr__,BasicContainer *this,Sampler *sampler)

{
  BasicPrimitive *pBVar1;
  uint uVar2;
  
  uVar2 = (*sampler->_vptr_Sampler[2])
                    (sampler,(ulong)((long)(this->list).
                                           super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->list).
                                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pBVar1 = (this->list).super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar2];
  (*(pBVar1->super_Primitive)._vptr_Primitive[2])(__return_storage_ptr__,pBVar1,sampler);
  __return_storage_ptr__->pdf =
       __return_storage_ptr__->pdf /
       (float)(ulong)((long)(this->list).
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->list).
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const override
	{
		unsigned id = sampler.get1u(list.size());
		SampleInfo info = list[id]->sampleSurface(sampler);
		info.pdf /= list.size();
		return info;
	}